

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

int __thiscall
TPZCompElH1<pzshape::TPZShapeLinear>::EffectiveSideOrder
          (TPZCompElH1<pzshape::TPZShapeLinear> *this,int side)

{
  TPZGeoEl *pTVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  uint uVar5;
  int is;
  string local_1c0 [32];
  TPZStack<int,_10> lowdim;
  
  uVar5 = 0;
  if (side == 2) {
    if ((this->fConnectIndexes).super_TPZVec<long>.fStore[2] == -1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&lowdim);
      poVar4 = std::operator<<((ostream *)
                               &lowdim.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements,
                               "virtual int TPZCompElH1<pzshape::TPZShapeLinear>::EffectiveSideOrder(int) const [TSHAPE = pzshape::TPZShapeLinear]"
                              );
      poVar4 = std::operator<<(poVar4," side ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::stringbuf::str();
      poVar4 = std::operator<<((ostream *)&std::cout,local_1c0);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string(local_1c0);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElH1.cpp"
                 ,0xe6);
    }
    TPZStack<int,_10>::TPZStack(&lowdim);
    pTVar1 = TPZCompEl::Reference((TPZCompEl *)this);
    (**(code **)(*(long *)pTVar1 + 0x220))(pTVar1,2,&lowdim);
    lVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,2);
    uVar5 = (uint)*(byte *)(lVar2 + 0x14);
    for (lVar2 = 0; lVar2 < lowdim.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
        lVar2 = lVar2 + 1) {
      lVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x318))
                        (this,lowdim.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[lVar2]);
      if (uVar5 <= *(byte *)(lVar3 + 0x14)) {
        uVar5 = (uint)*(byte *)(lVar3 + 0x14);
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&lowdim.super_TPZManVector<int,_10>);
  }
  return uVar5;
}

Assistant:

int TPZCompElH1<TSHAPE>::EffectiveSideOrder(int side) const {

	if(side < TSHAPE::NCornerNodes || side >= TSHAPE::NSides) return 0;
	if(fConnectIndexes[side] == -1)
	{
		std::stringstream sout ;
		sout << __PRETTY_FUNCTION__ << " side " << side << std::endl;
		//Print(sout);
#ifdef PZ_LOG
		LOGPZ_ERROR(logger,sout.str());
#else
		std::cout << sout.str() << std::endl;
#endif
		DebugStop();
		return -1;
	}
    TPZStack<int> lowdim;
    this->Reference()->LowerDimensionSides(side,lowdim);
	TPZConnect &c = this->Connect(side);
	int order = c.Order();
    for (int is=0; is<lowdim.size(); is++) {
        TPZConnect &c = this->MidSideConnect(lowdim[is]);
        if(c.Order() > order) order = c.Order();
    }
    return order;
}